

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<unsigned_int>
kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>::
Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser,ParserInput *input)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  int iVar4;
  NullableValue<unsigned_int> in_RDI;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  byte *pbVar8;
  
  pbVar6 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
  pbVar2 = (byte *)(input->super_IteratorInput<char,_const_char_*>).end;
  if (pbVar6 == pbVar2) {
    iVar4 = 0;
  }
  else {
    pbVar5 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
    iVar4 = 0;
    do {
      bVar1 = *pbVar6;
      uVar3 = (subParser->subParser).bits[bVar1 >> 6];
      pbVar7 = pbVar6 + ((uVar3 >> ((ulong)bVar1 & 0x3f) & 1) != 0);
      if ((uVar3 >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
        if (pbVar6 < pbVar7) {
          pbVar6 = pbVar7;
        }
        if (pbVar6 <= pbVar5) {
          pbVar6 = pbVar5;
        }
        (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar6;
        break;
      }
      (input->super_IteratorInput<char,_const_char_*>).pos = (char *)pbVar7;
      pbVar8 = pbVar7;
      if (pbVar7 <= pbVar6) {
        pbVar8 = pbVar6;
      }
      iVar4 = iVar4 + 1;
      if (pbVar5 < pbVar8) {
        pbVar5 = pbVar8;
      }
      (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar5;
      pbVar6 = pbVar7;
    } while (pbVar7 != pbVar2);
  }
  *(undefined1 *)in_RDI = 1;
  *(int *)((long)in_RDI + 4) = iVar4;
  return (Maybe<unsigned_int>)in_RDI;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }